

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void verifyDbFile(unixFile *pFile)

{
  byte *pbVar1;
  int iVar2;
  char *zFormat;
  stat buf;
  undefined1 auStack_98 [8];
  ino_t local_90;
  long local_88;
  
  if ((pFile->ctrlFlags & 0x100) != 0) {
    return;
  }
  iVar2 = (*aSyscall[5].pCurrent)((ulong)(uint)pFile->h,auStack_98);
  if (iVar2 != 0) {
    zFormat = "cannot fstat db file %s";
    goto LAB_0012ae84;
  }
  if (local_88 != 1) {
    if (local_88 != 0) {
      zFormat = "multiple links to file: %s";
      goto LAB_0012ae84;
    }
    if ((pFile->ctrlFlags & 0x20) == 0) {
      zFormat = "file unlinked while open: %s";
      goto LAB_0012ae84;
    }
  }
  if (pFile->pInode == (unixInodeInfo *)0x0) {
    return;
  }
  iVar2 = (*aSyscall[4].pCurrent)(pFile->zPath,auStack_98);
  zFormat = "file renamed while open: %s";
  if ((iVar2 == 0) && (local_90 == (pFile->pInode->fileId).ino)) {
    return;
  }
LAB_0012ae84:
  sqlite3_log(0x1c,zFormat,pFile->zPath);
  pbVar1 = (byte *)((long)&pFile->ctrlFlags + 1);
  *pbVar1 = *pbVar1 | 1;
  return;
}

Assistant:

static void verifyDbFile(unixFile *pFile){
  struct stat buf;
  int rc;
  if( pFile->ctrlFlags & UNIXFILE_WARNED ){
    /* One or more of the following warnings have already been issued.  Do not
    ** repeat them so as not to clutter the error log */
    return;
  }
  rc = osFstat(pFile->h, &buf);
  if( rc!=0 ){
    sqlite3_log(SQLITE_WARNING, "cannot fstat db file %s", pFile->zPath);
    pFile->ctrlFlags |= UNIXFILE_WARNED;
    return;
  }
  if( buf.st_nlink==0 && (pFile->ctrlFlags & UNIXFILE_DELETE)==0 ){
    sqlite3_log(SQLITE_WARNING, "file unlinked while open: %s", pFile->zPath);
    pFile->ctrlFlags |= UNIXFILE_WARNED;
    return;
  }
  if( buf.st_nlink>1 ){
    sqlite3_log(SQLITE_WARNING, "multiple links to file: %s", pFile->zPath);
    pFile->ctrlFlags |= UNIXFILE_WARNED;
    return;
  }
  if( pFile->pInode!=0
   && ((rc = osStat(pFile->zPath, &buf))!=0
       || buf.st_ino!=pFile->pInode->fileId.ino)
  ){
    sqlite3_log(SQLITE_WARNING, "file renamed while open: %s", pFile->zPath);
    pFile->ctrlFlags |= UNIXFILE_WARNED;
    return;
  }
}